

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O2

void __thiscall leveldb::Table::ReadMeta(Table *this,Footer *footer)

{
  long lVar1;
  Rep *pRVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  Block *this_00;
  Comparator *comparator;
  Iterator *pIVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long in_FS_OFFSET;
  Slice local_88;
  Slice local_78;
  ReadOptions opt;
  BlockContents contents;
  string key;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pRVar2 = this->rep_;
  if ((pRVar2->options).filter_policy != (FilterPolicy *)0x0) {
    opt.verify_checksums = false;
    opt.fill_cache = true;
    opt.snapshot = (Snapshot *)0x0;
    if ((pRVar2->options).paranoid_checks == true) {
      opt.verify_checksums = true;
      opt.fill_cache = true;
    }
    contents.data.data_ = "";
    contents.data.size_ = 0;
    ReadBlock((leveldb *)&key,pRVar2->file,&opt,&footer->metaindex_handle_,&contents);
    lVar3 = CONCAT44(key._M_dataplus._M_p._4_4_,key._M_dataplus._M_p._0_4_);
    Status::~Status((Status *)&key);
    if (lVar3 == 0) {
      this_00 = (Block *)operator_new(0x18);
      Block::Block(this_00,&contents);
      comparator = BytewiseComparator();
      pIVar6 = Block::NewIterator(this_00,comparator);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&key,"filter.",(allocator<char> *)&local_78);
      iVar5 = (*((this->rep_->options).filter_policy)->_vptr_FilterPolicy[2])();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&key,(char *)CONCAT44(extraout_var,iVar5));
      local_78.data_ = (char *)CONCAT44(key._M_dataplus._M_p._4_4_,key._M_dataplus._M_p._0_4_);
      (*pIVar6->_vptr_Iterator[5])(pIVar6);
      iVar5 = (*pIVar6->_vptr_Iterator[2])(pIVar6);
      if ((char)iVar5 != '\0') {
        iVar5 = (*pIVar6->_vptr_Iterator[8])(pIVar6);
        local_78.data_ = (char *)CONCAT44(extraout_var_00,iVar5);
        bVar4 = leveldb::operator==(&local_78,&local_88);
        if (bVar4) {
          iVar5 = (*pIVar6->_vptr_Iterator[9])(pIVar6);
          local_78.data_ = (char *)CONCAT44(extraout_var_01,iVar5);
          ReadFilter(this,&local_78);
        }
      }
      (*pIVar6->_vptr_Iterator[1])(pIVar6);
      Block::~Block(this_00);
      operator_delete(this_00,0x18);
      std::__cxx11::string::~string((string *)&key);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Table::ReadMeta(const Footer& footer) {
  if (rep_->options.filter_policy == nullptr) {
    return;  // Do not need any metadata
  }

  // TODO(sanjay): Skip this if footer.metaindex_handle() size indicates
  // it is an empty block.
  ReadOptions opt;
  if (rep_->options.paranoid_checks) {
    opt.verify_checksums = true;
  }
  BlockContents contents;
  if (!ReadBlock(rep_->file, opt, footer.metaindex_handle(), &contents).ok()) {
    // Do not propagate errors since meta info is not needed for operation
    return;
  }
  Block* meta = new Block(contents);

  Iterator* iter = meta->NewIterator(BytewiseComparator());
  std::string key = "filter.";
  key.append(rep_->options.filter_policy->Name());
  iter->Seek(key);
  if (iter->Valid() && iter->key() == Slice(key)) {
    ReadFilter(iter->value());
  }
  delete iter;
  delete meta;
}